

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_31a509::Handlers::addChoices
          (Handlers *this,char **choices,bool required,param_handler_t *fn)

{
  JSONHandler *this_00;
  anon_class_56_4_1d81f533 local_80;
  string_handler_t local_48;
  param_handler_t *local_28;
  param_handler_t *fn_local;
  char **ppcStack_18;
  bool required_local;
  char **choices_local;
  Handlers *this_local;
  
  this_00 = this->jh;
  local_28 = fn;
  fn_local._7_1_ = required;
  ppcStack_18 = choices;
  choices_local = (char **)this;
  std::function<void_(const_char_*)>::function(&local_80.fn,fn);
  local_80.choices = ppcStack_18;
  local_80.required = (bool)(fn_local._7_1_ & 1);
  local_80.this = this;
  std::function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::Handlers::addChoices(char_const**,bool,std::function<void(char_const*)>)::__0,void>
            ((function<void(std::__cxx11::string_const&,std::__cxx11::string_const&)> *)&local_48,
             &local_80);
  JSONHandler::addStringHandler(this_00,&local_48);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_48);
  (anonymous_namespace)::Handlers::addChoices(char_const**,bool,std::function<void(char_const*)>)::
  $_0::~__0((__0 *)&local_80);
  return;
}

Assistant:

void
Handlers::addChoices(char const** choices, bool required, param_handler_t fn)
{
    jh->addStringHandler(
        [fn, choices, required, this](std::string const& path, std::string const& parameter) {
            char const* p = parameter.c_str();
            bool matches = false;
            if ((!required) && (parameter.empty())) {
                matches = true;
            }
            if (!matches) {
                for (char const** i = choices; *i; ++i) {
                    if (strcmp(*i, p) == 0) {
                        QTC::TC("qpdf", "QPDFJob json choice match");
                        matches = true;
                        break;
                    }
                }
            }
            if (!matches) {
                QTC::TC("qpdf", "QPDFJob json choice mismatch");
                std::ostringstream msg;
                msg << path + ": unexpected value; expected one of ";
                bool first = true;
                for (char const** i = choices; *i; ++i) {
                    if (first) {
                        first = false;
                    } else {
                        msg << ", ";
                    }
                    msg << *i;
                }
                usage(msg.str());
            }
            fn(parameter.c_str());
        });
}